

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O3

double __thiscall TasGrid::RuleWavelet::eval_linear<1>(RuleWavelet *this,int point,double x)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  double dVar9;
  
  uVar1 = point - 1;
  iVar2 = 0;
  if (1 < uVar1) {
    iVar2 = 0;
    uVar3 = uVar1;
    do {
      uVar3 = (int)uVar3 >> 1;
      iVar2 = iVar2 + 1;
    } while (1 < uVar3);
  }
  iVar5 = 1 << ((byte)iVar2 & 0x1f);
  iVar4 = (int)uVar1 % iVar5;
  dVar6 = ldexp(1.0,iVar2 + -2);
  if (iVar4 == 0) {
    dVar9 = (x + 1.0) * dVar6 + -1.0;
    dVar7 = 0.0;
    if ((((0.5 < ABS(dVar9 + 0.5)) || (dVar7 = 5.25, dVar9 < -0.75)) || (0.0 < x && dVar9 == -0.75))
       || (((dVar7 = -2.75, dVar9 < -0.5 || (dVar9 == -0.5 && 0.0 < x)) ||
           (dVar7 = 0.25, dVar9 < 0.0)))) goto LAB_001c55fa;
    bVar8 = dVar9 != 0.0;
LAB_001c55e5:
    bVar8 = (bool)(x <= 0.0 | bVar8);
  }
  else {
    if (iVar4 != iVar5 + -1) {
      dVar9 = (x + 1.0) * dVar6 + -1.0 + (double)(iVar4 + -1) * -0.5;
      dVar7 = 0.0;
      if (((0.75 < ABS(dVar9 + 0.25)) || (dVar7 = -0.5, dVar9 < -0.5)) ||
         (((0.0 < x && dVar9 == -0.5 ||
           (((dVar7 = 4.0, dVar9 < -0.25 || (0.0 < x && dVar9 == -0.25)) ||
            (dVar7 = -4.0, dVar9 < 0.0)))) ||
          ((0.0 < x && dVar9 == 0.0 || (dVar7 = 0.5, dVar9 < 0.5)))))) goto LAB_001c55fa;
      bVar8 = dVar9 != 0.5;
      goto LAB_001c55e5;
    }
    dVar9 = (1.0 - x) * dVar6 + -1.0;
    dVar7 = 0.0;
    if (((0.5 < ABS(dVar9 + 0.5)) || (dVar7 = 5.25, dVar9 < -0.75)) ||
       ((x <= 0.0 && dVar9 == -0.75 ||
        (((dVar7 = -2.75, dVar9 < -0.5 || (dVar9 == -0.5 && x <= 0.0)) ||
         (dVar7 = 0.25, dVar9 < 0.0)))))) goto LAB_001c55fa;
    bVar8 = 0.0 < x || dVar9 != 0.0;
  }
  if (bVar8) {
    dVar7 = 0.0;
  }
LAB_001c55fa:
  if (iVar4 == iVar5 + -1) {
    dVar6 = -dVar6;
  }
  return dVar6 * dVar7;
}

Assistant:

inline double RuleWavelet::eval_linear(int point, double x) const{
    // Given a wavelet designated by point and a value x, evaluates the wavelet (or its derivative) at x.
    // If x <= 0 (resp. x > 0), we take only right (resp. left) derivatives.

    // Standard Lifted Wavelets
    int l = Maths::intlog2(point - 1);
    int subindex = (point - 1) % (1 << l);
    double scale = std::pow(2,l-2);

    double value;
    if (subindex == 0){
        // Left boundary wavelet.
        value = linear_boundary_wavelet<mode>(scale * (x + 1.) - 1., x <= 0.0);
    } else if (subindex == (1 << l) - 1) {
        // Right boundary wavelet.
        value = linear_boundary_wavelet<mode>(scale * (1. - x) - 1., x > 0.0);
    } else {
        // Central wavelets
        double shift = 0.5 * (double (subindex - 1));
        value = linear_central_wavelet<mode>(scale * (x + 1) - 1. - shift, x <= 0.0);
    }
    // Adjust for the chain rule multiplier.
    if (mode == 1) value *= (subindex == (1 << l) - 1) ? -scale : scale;

    return value;
}